

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
::ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                *this)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  char *pcVar1;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  if (*pcVar1 != 'v') {
    BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x212073);
  }
  DoReadReference(this);
  return;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }